

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_default_vfs_seek(ma_vfs *pVFS,ma_vfs_file file,ma_int64 offset,ma_seek_origin origin)

{
  int iVar1;
  
  if (file != (ma_vfs_file)0x0) {
    iVar1 = (origin == ma_seek_origin_end) + 1;
    if (origin == ma_seek_origin_start) {
      iVar1 = 0;
    }
    iVar1 = fseek((FILE *)file,offset,iVar1);
    return -(uint)(iVar1 != 0);
  }
  return MA_INVALID_ARGS;
}

Assistant:

static ma_result ma_default_vfs_seek(ma_vfs* pVFS, ma_vfs_file file, ma_int64 offset, ma_seek_origin origin)
{
    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_WIN32) && defined(MA_WIN32_DESKTOP) && !defined(MA_NO_WIN32_FILEIO)
    return ma_default_vfs_seek__win32(pVFS, file, offset, origin);
#else
    return ma_default_vfs_seek__stdio(pVFS, file, offset, origin);
#endif
}